

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::TokenManager::Init
          (Error *__return_storage_ptr__,TokenManager *this,Config *aConfig)

{
  string *this_00;
  pointer pcVar1;
  ErrorCode EVar2;
  TokenManager *pTVar3;
  mbedtls_pk_context_conflict trustAnchorPublicKey;
  mbedtls_pk_context_conflict privateKey;
  mbedtls_pk_context_conflict publicKey;
  mbedtls_pk_context local_108;
  mbedtls_pk_context local_f0;
  mbedtls_pk_context local_d8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [104];
  char *local_50 [2];
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pTVar3 = this;
  mbedtls_pk_init(&local_d8);
  mbedtls_pk_init(&local_f0);
  mbedtls_pk_init(&local_108);
  ParsePublicKey((Error *)local_c0,pTVar3,(mbedtls_pk_context_conflict *)&local_d8,
                 &aConfig->mCertificate);
  __return_storage_ptr__->mCode = local_c0._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)local_b8);
  EVar2 = __return_storage_ptr__->mCode;
  pcVar1 = local_b8 + 0x10;
  if ((pointer)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (EVar2 == kNone) {
    ParsePrivateKey((Error *)local_c0,this,(mbedtls_pk_context_conflict *)&local_f0,
                    &aConfig->mPrivateKey);
    pTVar3 = (TokenManager *)local_b8;
    __return_storage_ptr__->mCode = local_c0._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)pTVar3);
    EVar2 = __return_storage_ptr__->mCode;
    if ((pointer)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_);
    }
    if (EVar2 == kNone) {
      ParsePublicKey((Error *)local_c0,pTVar3,(mbedtls_pk_context_conflict *)&local_108,
                     &aConfig->mTrustAnchor);
      __return_storage_ptr__->mCode = local_c0._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_b8);
      EVar2 = __return_storage_ptr__->mCode;
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_);
      }
      if (EVar2 == kNone) {
        GetDtlsConfig((DtlsConfig *)local_c0,aConfig);
        DtlsSession::Init((Error *)(local_b8 + 0x60),&(this->mRegistrarClient).mDtlsSession,
                          (DtlsConfig *)local_c0);
        __return_storage_ptr__->mCode = local_b8._96_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
        EVar2 = __return_storage_ptr__->mCode;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if ((pointer)local_b8._72_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._72_8_);
        }
        if ((void *)local_b8._48_8_ != (void *)0x0) {
          operator_delete((void *)local_b8._48_8_);
        }
        if ((void *)local_b8._24_8_ != (void *)0x0) {
          operator_delete((void *)local_b8._24_8_);
        }
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_);
        }
        if (EVar2 == kNone) {
          std::__cxx11::string::_M_assign((string *)&this->mCommissionerId);
          std::__cxx11::string::_M_assign((string *)&this->mDomainName);
          mbedtls_pk_free((mbedtls_pk_context *)&this->mPublicKey);
          (this->mPublicKey).private_priv_id = local_d8.priv_id;
          *(undefined4 *)&(this->mPublicKey).field_0x14 = local_d8._20_4_;
          (this->mPublicKey).private_pk_info = local_d8.pk_info;
          (this->mPublicKey).private_pk_ctx = local_d8.pk_ctx;
          mbedtls_pk_init(&local_d8);
          mbedtls_pk_free((mbedtls_pk_context *)&this->mPrivateKey);
          (this->mPrivateKey).private_priv_id = local_f0.priv_id;
          *(undefined4 *)&(this->mPrivateKey).field_0x14 = local_f0._20_4_;
          (this->mPrivateKey).private_pk_info = local_f0.pk_info;
          (this->mPrivateKey).private_pk_ctx = local_f0.pk_ctx;
          mbedtls_pk_init(&local_f0);
          mbedtls_pk_free((mbedtls_pk_context *)&this->mDomainCAPublicKey);
          (this->mDomainCAPublicKey).private_priv_id = local_108.priv_id;
          *(undefined4 *)&(this->mDomainCAPublicKey).field_0x14 = local_108._20_4_;
          (this->mDomainCAPublicKey).private_pk_info = local_108.pk_info;
          (this->mDomainCAPublicKey).private_pk_ctx = local_108.pk_ctx;
          mbedtls_pk_init(&local_108);
        }
      }
    }
  }
  mbedtls_pk_free(&local_108);
  mbedtls_pk_free(&local_f0);
  mbedtls_pk_free(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::Init(const Config &aConfig)
{
    Error              error;
    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;
    mbedtls_pk_context trustAnchorPublicKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);
    mbedtls_pk_init(&trustAnchorPublicKey);

    SuccessOrExit(error = ParsePublicKey(publicKey, aConfig.mCertificate));
    SuccessOrExit(error = ParsePrivateKey(privateKey, aConfig.mPrivateKey));
    SuccessOrExit(error = ParsePublicKey(trustAnchorPublicKey, aConfig.mTrustAnchor));

    SuccessOrExit(error = mRegistrarClient.Init(GetDtlsConfig(aConfig)));

    mCommissionerId = aConfig.mId;
    mDomainName     = aConfig.mDomainName;

    // Move mbedtls keys
    MoveMbedtlsKey(mPublicKey, publicKey);
    MoveMbedtlsKey(mPrivateKey, privateKey);
    MoveMbedtlsKey(mDomainCAPublicKey, trustAnchorPublicKey);

exit:
    mbedtls_pk_free(&trustAnchorPublicKey);
    mbedtls_pk_free(&privateKey);
    mbedtls_pk_free(&publicKey);
    return error;
}